

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,char *fileName,int numThreads)

{
  int iVar1;
  Data *pDVar2;
  StdIFStream *this_00;
  InputStreamMutex *pIVar3;
  stringstream _iex_replace_s;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__DeepScanLineInputFile_02f9d000;
  pDVar2 = (Data *)operator_new(0x208);
  Data::Data(pDVar2,numThreads);
  this->_data = pDVar2;
  pDVar2->_deleteStream = true;
  this_00 = (StdIFStream *)operator_new(0x38);
  StdIFStream::StdIFStream(this_00,fileName);
  GenericInputFile::readMagicNumberAndVersionField
            (&this->super_GenericInputFile,(IStream *)this_00,&this->_data->version);
  pDVar2 = this->_data;
  if ((pDVar2->version & 0x1000) == 0) {
    pIVar3 = (InputStreamMutex *)operator_new(0x38);
    (pIVar3->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    pIVar3->is = (IStream *)0x0;
    *(undefined8 *)((long)&(pIVar3->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
    (pIVar3->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    pIVar3->currentPosition = 0;
    (pIVar3->super_Mutex).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(pIVar3->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
    pDVar2->_streamData = pIVar3;
    pIVar3->is = (IStream *)this_00;
    iVar1 = (*(this_00->super_IStream)._vptr_IStream[2])(this_00);
    pDVar2 = this->_data;
    pDVar2->memoryMapped = SUB41(iVar1,0);
    Header::readFrom(&pDVar2->header,pDVar2->_streamData->is,&pDVar2->version);
    Header::sanityCheck(&this->_data->header,(bool)((byte)((uint)this->_data->version >> 9) & 1),
                        false);
    initialize(this,&this->_data->header);
    pDVar2 = this->_data;
    anon_unknown_7::readLineOffsets
              (pDVar2->_streamData->is,pDVar2->lineOrder,&pDVar2->lineOffsets,
               &pDVar2->fileIsComplete);
  }
  else {
    compatibilityInitialize(this,(IStream *)this_00);
  }
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile
    (const char fileName[], int numThreads)
:
     _data (new Data (numThreads))
{
    _data->_deleteStream = true;
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream* is = 0;

    try
    {
        is = new StdIFStream (fileName);
        readMagicNumberAndVersionField(*is, _data->version);
        //
        // Backward compatibility to read multpart file.
        // multiPartInitialize will create _streamData
        if (isMultiPart(_data->version))
        {
            compatibilityInitialize(*is);
            return;
        }
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (is)          delete is;
        if (_data)       delete _data;

        REPLACE_EXC (e, "Cannot read image file "
                     "\"" << fileName << "\". " << e.what());
        throw;
    }

    // 
    // not multiPart - allocate stream data and intialise as normal
    //
    try
    { 
        _data->_streamData = new InputStreamMutex();
        _data->_streamData->is = is;
        _data->memoryMapped = is->isMemoryMapped();
        _data->header.readFrom (*_data->_streamData->is, _data->version);
        _data->header.sanityCheck (isTiled (_data->version));

        initialize(_data->header);

        readLineOffsets (*_data->_streamData->is,
                         _data->lineOrder,
                         _data->lineOffsets,
                         _data->fileIsComplete);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (is)          delete is;
        if (_data && _data->_streamData)
        {
            delete _data->_streamData;
        }
        if (_data)       delete _data;

        REPLACE_EXC (e, "Cannot read image file "
                     "\"" << fileName << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        if (is)          delete is;
        if (_data && _data->_streamData)
        {
            delete _data->_streamData;
        }
        if (_data)       delete _data;

        throw;
    }
}